

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
* __thiscall
Lexer::lexTheFlightTextFile_abi_cxx11_
          (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *__return_storage_ptr__,Lexer *this)

{
  pointer *ppbVar1;
  string *psVar2;
  pointer pbVar3;
  bool bVar4;
  istream *piVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  _Rb_tree_node_base *p_Var9;
  string *psVar10;
  ostream *poVar11;
  long lVar12;
  Lexer *this_00;
  pointer pbVar13;
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  long local_560;
  ifstream inFile;
  byte abStack_540 [488];
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string left;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  undefined1 local_160 [8];
  string right;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  has_key_words;
  undefined1 local_d8 [8];
  string sec_right;
  string right_1;
  size_type has_while;
  size_type has_if;
  size_type has_var;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_78;
  Lexer *local_70;
  undefined1 auStack_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command_vector;
  string line;
  
  std::ifstream::ifstream((string *)&local_560);
  local_70 = this;
  std::ifstream::open((string *)&local_560,(_Ios_Openmode)this);
  if ((abStack_540[*(long *)(local_560 + -0x18)] & 5) != 0) {
    poVar11 = std::operator<<((ostream *)&std::cerr,"Error opeing a file");
    std::endl<char,std::char_traits<char>>(poVar11);
    std::ifstream::close();
    exit(1);
  }
  command_vector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  local_78 = &local_70->text_commands_lexed;
  do {
    do {
      this_00 = (Lexer *)&command_vector.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_560,(string *)this_00);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        std::ifstream::close();
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::vector(__return_storage_ptr__,local_78);
        std::__cxx11::string::~string
                  ((string *)
                   &command_vector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::ifstream::~ifstream(&local_560);
        return __return_storage_ptr__;
      }
    } while (line._M_dataplus._M_p == (pointer)0x0);
    ppbVar1 = &command_vector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    trim((string *)&stack0xfffffffffffffe28,this_00,(string *)ppbVar1);
    std::__cxx11::string::operator=((string *)ppbVar1,(string *)&stack0xfffffffffffffe28);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
    auStack_68 = (undefined1  [8])0x0;
    command_vector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    command_vector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    right_1.field_2._8_8_ = std::__cxx11::string::find((char *)ppbVar1,0x10e05d);
    has_while = std::__cxx11::string::find((char *)ppbVar1,0x10e063);
    has_if = std::__cxx11::string::find((char *)ppbVar1,0x10e04d);
    has_var = std::__cxx11::string::find((char)ppbVar1,0x28);
    lVar6 = std::__cxx11::string::find((char *)ppbVar1,0x10e992);
    lVar7 = std::__cxx11::string::find((char *)ppbVar1,0x10e051);
    lVar8 = std::__cxx11::string::find((char)ppbVar1,0x7d);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<unsigned_long_&,_const_char_(&)[6],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&stack0xfffffffffffffe28,(unsigned_long *)(right_1.field_2._M_local_buf + 8),
               (char (*) [6])"while");
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<unsigned_long_&,_const_char_(&)[3],_true>(&local_1b0,&has_while,(char (*) [3])"if");
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<unsigned_long_&,_const_char_(&)[4],_true>(&local_188,&has_if,(char (*) [4])"var");
    __l._M_len = 3;
    __l._M_array = (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xfffffffffffffe28;
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)((long)&right.field_2 + 8),__l,(less<int> *)local_160,
          (allocator_type *)(sec_right.field_2._M_local_buf + 8));
    lVar12 = 0x58;
    do {
      std::__cxx11::string::~string((string *)(&stack0xfffffffffffffe28 + lVar12));
      lVar12 = lVar12 + -0x28;
    } while (lVar12 != -0x20);
    p_Var9 = has_key_words._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (((has_while == 0xffffffffffffffff) && (right_1.field_2._8_8_ == -1)) &&
       (has_if == 0xffffffffffffffff)) {
      if (lVar7 == -1) {
        std::__cxx11::string::string
                  ((string *)&local_358,
                   (string *)
                   &command_vector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        removeToken((string *)&stack0xfffffffffffffe28,&local_358,' ');
        std::__cxx11::string::operator=
                  ((string *)
                   &command_vector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (string *)&stack0xfffffffffffffe28);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
        std::__cxx11::string::~string((string *)&local_358);
      }
      ppbVar1 = &command_vector.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      lVar12 = std::__cxx11::string::find((char)ppbVar1,0x3d);
      if (lVar12 == -1) {
        if (has_var != 0xffffffffffffffff) {
          std::__cxx11::string::substr
                    ((ulong)&stack0xfffffffffffffe28,
                     (ulong)&command_vector.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::string((string *)&local_338,(string *)&stack0xfffffffffffffe28);
          removeToken((string *)local_160,&local_338,'(');
          std::__cxx11::string::operator=((string *)&stack0xfffffffffffffe28,(string *)local_160);
          std::__cxx11::string::~string((string *)local_160);
          std::__cxx11::string::~string((string *)&local_338);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_68,(value_type *)&stack0xfffffffffffffe28);
          psVar10 = (string *)
                    std::__cxx11::string::erase
                              ((ulong)&command_vector.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          std::__cxx11::string::string((string *)local_160,psVar10);
          std::__cxx11::string::string((string *)&local_318,(string *)local_160);
          psVar2 = (string *)(&sec_right.field_2._M_allocated_capacity + 1);
          removeToken(psVar2,&local_318,'(');
          std::__cxx11::string::operator=((string *)local_160,(string *)psVar2);
          std::__cxx11::string::~string((string *)psVar2);
          std::__cxx11::string::~string((string *)&local_318);
          std::__cxx11::string::string((string *)&local_2f8,(string *)local_160);
          removeToken(psVar2,&local_2f8,')');
          std::__cxx11::string::operator=((string *)local_160,(string *)psVar2);
          std::__cxx11::string::~string((string *)psVar2);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::string((string *)&local_2d8,(string *)local_160);
          removeToken(psVar2,&local_2d8,'\"');
          std::__cxx11::string::operator=((string *)local_160,(string *)psVar2);
          std::__cxx11::string::~string((string *)psVar2);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_68,(string *)local_160);
LAB_00107b29:
          std::__cxx11::string::~string((string *)local_160);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_68,(value_type *)ppbVar1);
      }
    }
    else {
      for (; p_Var9 != (_Rb_tree_node_base *)&has_key_words;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        if (p_Var9[1]._M_color != ~_S_red) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_68,(value_type *)&p_Var9[1]._M_parent);
          ppbVar1 = &command_vector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::erase((ulong)ppbVar1,(long)(int)p_Var9[1]._M_color);
          std::__cxx11::string::string((string *)&local_2b8,(string *)ppbVar1);
          removeToken((string *)&stack0xfffffffffffffe28,&local_2b8,' ');
          std::__cxx11::string::operator=
                    ((string *)
                     &command_vector.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (string *)&stack0xfffffffffffffe28);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
          std::__cxx11::string::~string((string *)&local_2b8);
        }
      }
      pbVar3 = (local_70->operators_to_check).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar13 = (local_70->operators_to_check).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar3;
          pbVar13 = pbVar13 + 1) {
        std::__cxx11::string::string((string *)&stack0xfffffffffffffe28,(string *)pbVar13);
        lVar12 = std::__cxx11::string::find
                           ((string *)
                            &command_vector.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (ulong)&stack0xfffffffffffffe28);
        if (lVar12 != -1) {
          std::__cxx11::string::substr
                    ((ulong)local_160,
                     (ulong)&command_vector.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::string
                    ((string *)&has_key_words._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_160);
          psVar2 = (string *)(sec_right.field_2._M_local_buf + 8);
          removeToken(psVar2,(string *)
                             &has_key_words._M_t._M_impl.super__Rb_tree_header._M_node_count,'(');
          std::__cxx11::string::operator=((string *)local_160,(string *)psVar2);
          std::__cxx11::string::~string((string *)psVar2);
          std::__cxx11::string::~string
                    ((string *)&has_key_words._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_68,(string *)local_160);
          std::__cxx11::string::erase
                    ((ulong)&command_vector.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_68,(value_type *)&stack0xfffffffffffffe28);
          std::__cxx11::string::erase
                    ((ulong)&command_vector.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          std::__cxx11::string::string
                    ((string *)(sec_right.field_2._M_local_buf + 8),
                     (string *)
                     &command_vector.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (lVar6 == -1) {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&stack0xfffffffffffffe28,"<-");
            if ((bVar4) ||
               (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&stack0xfffffffffffffe28,"->"), bVar4)) {
              std::__cxx11::string::string
                        ((string *)&local_218,(string *)(sec_right.field_2._M_local_buf + 8));
              removeToken((string *)local_d8,&local_218,')');
              std::__cxx11::string::operator=
                        ((string *)(sec_right.field_2._M_local_buf + 8),(string *)local_d8);
              std::__cxx11::string::~string((string *)local_d8);
              std::__cxx11::string::~string((string *)&local_218);
            }
            std::__cxx11::string::string
                      ((string *)&local_1f8,(string *)(sec_right.field_2._M_local_buf + 8));
            removeToken((string *)local_d8,&local_1f8,'{');
            std::__cxx11::string::operator=
                      ((string *)(sec_right.field_2._M_local_buf + 8),(string *)local_d8);
            std::__cxx11::string::~string((string *)local_d8);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_68,(value_type *)(sec_right.field_2._M_local_buf + 8));
          }
          else {
            std::__cxx11::string::substr
                      ((ulong)local_d8,
                       (ulong)&command_vector.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_160,(string *)local_d8);
            std::__cxx11::string::~string((string *)local_d8);
            std::__cxx11::string::string((string *)&local_298,(string *)local_160);
            removeToken((string *)local_d8,&local_298,'(');
            std::__cxx11::string::operator=((string *)local_160,(string *)local_d8);
            std::__cxx11::string::~string((string *)local_d8);
            std::__cxx11::string::~string((string *)&local_298);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_68,(string *)local_160);
            std::__cxx11::string::erase
                      ((ulong)&command_vector.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
            std::__cxx11::string::string
                      ((string *)local_d8,
                       (string *)
                       &command_vector.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&stack0xfffffffffffffe28,"<-");
            if ((bVar4) ||
               (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&stack0xfffffffffffffe28,"->"), bVar4)) {
              std::__cxx11::string::string((string *)&local_258,(string *)local_d8);
              removeToken(&local_278,&local_258,')');
              std::__cxx11::string::operator=((string *)local_d8,(string *)&local_278);
              std::__cxx11::string::~string((string *)&local_278);
              std::__cxx11::string::~string((string *)&local_258);
            }
            std::__cxx11::string::string((string *)&local_238,(string *)local_d8);
            removeToken(&local_278,&local_238,'\"');
            std::__cxx11::string::operator=((string *)local_d8,(string *)&local_278);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_238);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_68,(value_type *)local_d8);
            std::__cxx11::string::~string((string *)local_d8);
          }
          std::__cxx11::string::~string((string *)(sec_right.field_2._M_local_buf + 8));
          goto LAB_00107b29;
        }
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
      }
    }
    if (lVar8 != -1) {
      std::__cxx11::string::string((string *)&stack0xfffffffffffffe28,"}",(allocator *)local_160);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffe28);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
    }
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(local_78,(value_type *)auStack_68);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&right.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_68);
  } while( true );
}

Assistant:

vector<vector<string>> Lexer::lexTheFlightTextFile() {

  ifstream inFile; // open the file stream
  inFile.open(this->flight_text_file);
  if (inFile.fail()) { // check if opening a file failed
    cerr << "Error opeing a file" << endl;
    inFile.close();
    exit(1);
  }
  string line;
  // lex line after line - i chose to work in the onion slicing method
  while (getline(inFile, line)) {
    if (line.empty()) {
      continue;
    }
    // get rid of tabs
    line = trim(line);
    vector<string> command_vector;
    // important keyword i look for in the string
    string::size_type has_while = line.find("while");
    string::size_type has_if = line.find("if");
    string::size_type has_var = line.find("var");
    string::size_type has_left_parent = line.find('(');
    string::size_type has_sim = line.find("sim");
    string::size_type has_print = line.find("Print");
    string::size_type has_end_condition = line.find('}');
    map<int, string> has_key_words = {{has_while, "while"}, {has_if, "if"},
                                      {has_var, "var"}};
    // NOT var / while / if :
    if (has_if == string::npos && has_while == string::npos && has_var ==
        string::npos) {
      // get rid of spaces in case its not a print
      if (has_print == string::npos) {
        line = this->removeToken(line, ' ');
      }
      // assignments (set vars)
      if (line.find('=') != string::npos) {
        command_vector.push_back(line);
      } else if (has_left_parent != string::npos) {
        string left = line.substr(0, has_left_parent);
        left = this->removeToken(left, '(');
        command_vector.push_back(left);
        string right = line.erase(0, has_left_parent);
        right = this->removeToken(right, '(');
        right = this->removeToken(right, ')');
        right = this->removeToken(right, '"');
        command_vector.push_back(right);
      }
    } else {
      // var / while / if :
      // dont minimize spaces after the keyword while, if, var
      // put the keyword in a command vector and remove her from line :)
      for (auto it = has_key_words.begin(); it != has_key_words.end(); ++it) {
        if (string::size_type(it->first) != string::npos) {
          command_vector.push_back(it->second);
          line.erase(it->first, it->second.size());
          line = this->removeToken(line, ' ');
        }
      }
      // find "<-" , "->" , "=", "<=" , "<", ">" , ">=" .
      // put every part (left, keyword, right" inside command vector
      for (string op : this->operators_to_check) {
        string::size_type has_op = line.find(op);
        if (has_op != string::npos) {
          string left = line.substr(0, has_op);
          left = this->removeToken(left, '(');
          command_vector.push_back(left);
          line.erase(0, has_op);
          command_vector.push_back(op);
          line.erase(0, op.size());
          string right = line;
          if (has_sim != string::npos) {
            left = line.substr(0, 4);
            left = this->removeToken(left, '(');
            command_vector.push_back(left);
            line.erase(0, 4);
            string sec_right = line;
            if (op == "<-" || op == "->") {
              sec_right = this->removeToken(sec_right, ')');
            }
            sec_right = this->removeToken(sec_right, '"');
            command_vector.push_back(sec_right);
            break;
          }
          if (op == "<-" || op == "->") {
            right = this->removeToken(right, ')');
          }
          right = this->removeToken(right, '{');
          command_vector.push_back(right);
          break;
        }
      }
    }
    if (has_end_condition != string::npos) {
      command_vector.push_back("}");
    }
    text_commands_lexed.push_back(command_vector);
  }
  // close the file stream
  inFile.close();
  // return the vector of vectors :) (all the strings representing commands)
  return this->text_commands_lexed;
}